

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SpanTest_CtorFromVector_Test::TestBody(SpanTest_CtorFromVector_Test *this)

{
  int *piVar1;
  size_t in_R8;
  initializer_list<int> __l;
  Span<const_int> s;
  Span<int> s_00;
  allocator_type local_29;
  vector<int,_std::allocator<int>_> v;
  int local_10 [2];
  
  local_10[0] = 1;
  local_10[1] = 2;
  __l._M_len = 2;
  __l._M_array = local_10;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_29);
  piVar1 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  s.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
  s.data_ = piVar1;
  TestConstCtor((anon_unknown_0 *)
                v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start,s,piVar1,in_R8);
  piVar1 = (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  s_00.size_ = (size_t)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
  s_00.data_ = piVar1;
  TestCtor((anon_unknown_0 *)
           v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start,
           s_00,piVar1,in_R8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(SpanTest, CtorFromVector) {
  std::vector<int> v = {1, 2};
  // Const ctor is implicit.
  TestConstCtor(v, v.data(), v.size());
  // Mutable is explicit.
  Span<int> s(v);
  TestCtor(s, v.data(), v.size());
}